

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O1

BVSparse<Memory::JitArenaAllocator> ** __thiscall
HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator>::Get
          (HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *this,int value)

{
  int iVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Type *pTVar5;
  char cVar6;
  Type *unaff_R13;
  Type *pTVar7;
  undefined1 local_40 [8];
  Iterator __iter;
  
  local_40 = (undefined1  [8])(this->table + (ulong)(uint)value % (ulong)this->tableSize);
  __iter.list = (SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
                 *)local_40;
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  while( true ) {
    if (__iter.list ==
        (SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
         *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    __iter.list = (SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
                   *)((__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
    if ((undefined1  [8])__iter.list == local_40) break;
    pTVar5 = SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
             ::Iterator::Data((Iterator *)local_40);
    iVar1 = pTVar5->value;
    if (iVar1 != value) {
      pTVar5 = unaff_R13;
    }
    if (iVar1 <= value) {
      unaff_R13 = pTVar5;
    }
    cVar6 = (iVar1 != value) * '\x02' + '\x01';
    if (value < iVar1) {
      cVar6 = '\0';
    }
    if (cVar6 != '\0') {
      pTVar7 = (Type *)0x0;
      if ((cVar6 != '\x03') && (pTVar7 = pTVar5, value < iVar1)) {
        pTVar7 = (Type *)0x0;
      }
      return &pTVar7->element;
    }
  }
  return (BVSparse<Memory::JitArenaAllocator> **)0x0;
}

Assistant:

T * Get(int value)
    {
        // Assumes sorted lists
        FOREACH_SLISTBASE_ENTRY(Bucket<T>, bucket, &this->table[this->Hash(value)])
        {
            if (bucket.value <= value)
            {
                if (bucket.value == value)
                {
                    return &(bucket.element);
                }
                break;
            }
        } NEXT_SLISTBASE_ENTRY;

        return nullptr;
    }